

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O0

Mat * __thiscall ncnn::Mat::reshape(Mat *this,int _w,int _h,int _c,Allocator *_allocator)

{
  size_t sVar1;
  int in_ECX;
  ulong uVar2;
  int in_EDX;
  Mat *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  undefined8 in_R9;
  int _c_00;
  Mat tmp;
  void *mptr;
  void *ptr;
  int i;
  Mat *m;
  int in_stack_ffffffffffffff34;
  size_t in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  int _c_01;
  Mat *pMVar3;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  int in_stack_ffffffffffffff74;
  Mat *in_stack_ffffffffffffff78;
  int local_40;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  int in_stack_ffffffffffffffe0;
  
  _c_00 = (int)((ulong)in_R9 >> 0x20);
  _c_01 = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  if (in_RSI->w * in_RSI->h * in_RSI->c == in_EDX * in_ECX * in_R8D) {
    pMVar3 = in_RDI;
    if (in_RSI->dims < 3) {
      uVar2 = (long)in_EDX * (long)in_ECX;
      sVar1 = ncnn::alignSize((long)(in_EDX * in_ECX) * in_RSI->elemsize,0x10);
      if (uVar2 != sVar1 / in_RSI->elemsize) {
        Mat(pMVar3);
        create(pMVar3,(int)(uVar2 >> 0x20),(int)uVar2,_c_01,in_stack_ffffffffffffff38,
               in_stack_ffffffffffffff34,(Allocator *)in_RSI);
        for (local_40 = 0; local_40 < in_R8D; local_40 = local_40 + 1) {
          memcpy((void *)((long)pMVar3->data + (long)local_40 * pMVar3->cstep * pMVar3->elemsize),
                 (void *)((long)in_RSI->data + (long)(local_40 * in_EDX * in_ECX) * in_RSI->elemsize
                         ),(long)(in_EDX * in_ECX) * in_RSI->elemsize);
        }
        return in_RDI;
      }
    }
    else if (in_RSI->c != in_R8D) {
      reshape(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
              (Allocator *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      reshape((Mat *)CONCAT44(in_EDX,in_ECX),in_R8D,in_stack_ffffffffffffffe0,_c_00,
              (Allocator *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
      ~Mat((Mat *)0x166be2);
      return in_RDI;
    }
    Mat(pMVar3,in_RSI);
    pMVar3->dims = 3;
    pMVar3->w = in_EDX;
    pMVar3->h = in_ECX;
    pMVar3->c = in_R8D;
    sVar1 = ncnn::alignSize((long)(in_EDX * in_ECX) * in_RSI->elemsize,0x10);
    pMVar3->cstep = sVar1 / in_RSI->elemsize;
  }
  else {
    Mat(in_RDI);
  }
  return in_RDI;
}

Assistant:

inline Mat Mat::reshape(int _w, int _h, int _c, Allocator* _allocator) const
{
    if (w * h * c != _w * _h * _c)
        return Mat();

    if (dims < 3)
    {
        if ((size_t)_w * _h != alignSize(_w * _h * elemsize, 16) / elemsize)
        {
            Mat m;
            m.create(_w, _h, _c, elemsize, elempack, _allocator);

            // align channel
            for (int i=0; i<_c; i++)
            {
                const void* ptr = (unsigned char*)data + i * _w * _h * elemsize;
                void* mptr = (unsigned char*)m.data + i * m.cstep * m.elemsize;
                memcpy(mptr, ptr, _w * _h * elemsize);
            }

            return m;
        }
    }
    else if (c != _c)
    {
        // flatten and then align
        Mat tmp = reshape(_w * _h * _c, _allocator);
        return tmp.reshape(_w, _h, _c, _allocator);
    }

    Mat m = *this;

    m.dims = 3;
    m.w = _w;
    m.h = _h;
    m.c = _c;

    m.cstep = alignSize(_w * _h * elemsize, 16) / elemsize;

    return m;
}